

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool string_split(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  uint uVar1;
  gravity_object_t *pgVar2;
  uint32_t uVar3;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_value_t *pgVar5;
  char *pcVar6;
  undefined6 in_register_00000012;
  _Bool _Var7;
  uint len;
  char *pcVar8;
  char *pcVar9;
  gravity_class_t *pgVar10;
  gravity_class_t *s;
  uint32_t i;
  uint uVar11;
  gravity_value_t value;
  gravity_value_t gVar12;
  char _buffer [4096];
  
  if (((int)CONCAT62(in_register_00000012,nargs) == 2) && (args[1].isa == gravity_class_string)) {
    pgVar2 = (args->field_1).p;
    pgVar10 = (args[1].field_1.p)->objclass;
    uVar1 = *(uint *)((long)&(args[1].field_1.p)->identifier + 4);
    uVar11 = 0;
    gravity_gc_setenabled(vm,false);
    aVar4.p = (gravity_object_t *)gravity_list_new(vm,0);
    s = pgVar2->objclass;
    len = *(uint *)((long)&pgVar2->identifier + 4);
    if ((ulong)uVar1 == 0) {
      for (; uVar11 < len; uVar11 = uVar11 + uVar3) {
        uVar3 = utf8_charbytes((char *)s,0);
        pcVar6 = (char *)((gravity_value_r *)&(aVar4.p)->objclass)->n;
        pgVar5 = *(gravity_value_t **)&(aVar4.p)->has_outer;
        if (pcVar6 == (aVar4.p)->identifier) {
          pcVar8 = (char *)((long)pcVar6 * 2);
          if (pcVar6 == (char *)0x0) {
            pcVar8 = (char *)0x8;
          }
          (aVar4.p)->identifier = pcVar8;
          pgVar5 = (gravity_value_t *)realloc(pgVar5,(long)pcVar8 << 4);
          *(gravity_value_t **)&(aVar4.p)->has_outer = pgVar5;
          pcVar6 = (char *)((gravity_value_r *)&(aVar4.p)->objclass)->n;
        }
        ((gravity_value_r *)&(aVar4.p)->objclass)->n = (size_t)(pcVar6 + 1);
        gVar12 = gravity_string_to_value(vm,(char *)s,uVar3);
        pgVar5[(long)pcVar6].isa = gVar12.isa;
        pgVar5[(long)pcVar6].field_1.n = (gravity_int_t)gVar12.field_1;
        s = (gravity_class_t *)((long)&s->isa + (ulong)uVar3);
      }
      gravity_gc_setenabled(vm,true);
      pgVar10 = (aVar4.p)->isa;
    }
    else {
      while (pcVar6 = string_strnstr((char *)s,(char *)pgVar10,(ulong)len), pcVar6 != (char *)0x0) {
        pcVar8 = (char *)((gravity_value_r *)&(aVar4.p)->objclass)->n;
        pgVar5 = *(gravity_value_t **)&(aVar4.p)->has_outer;
        if (pcVar8 == (aVar4.p)->identifier) {
          pcVar9 = (char *)((long)pcVar8 * 2);
          if (pcVar8 == (char *)0x0) {
            pcVar9 = (char *)0x8;
          }
          (aVar4.p)->identifier = pcVar9;
          pgVar5 = (gravity_value_t *)realloc(pgVar5,(long)pcVar9 << 4);
          *(gravity_value_t **)&(aVar4.p)->has_outer = pgVar5;
          pcVar8 = (char *)((gravity_value_r *)&(aVar4.p)->objclass)->n;
        }
        uVar3 = (int)pcVar6 - (int)s;
        ((gravity_value_r *)&(aVar4.p)->objclass)->n = (size_t)(pcVar8 + 1);
        gVar12 = gravity_string_to_value(vm,(char *)s,uVar3);
        pgVar5[(long)pcVar8].isa = gVar12.isa;
        pgVar5[(long)pcVar8].field_1.n = (gravity_int_t)gVar12.field_1;
        s = (gravity_class_t *)(pcVar6 + uVar1);
        len = len - (uVar3 + uVar1);
      }
      pcVar6 = (char *)((gravity_value_r *)&(aVar4.p)->objclass)->n;
      pgVar5 = *(gravity_value_t **)&(aVar4.p)->has_outer;
      if (pcVar6 == (aVar4.p)->identifier) {
        pcVar8 = (char *)((long)pcVar6 * 2);
        if (pcVar6 == (char *)0x0) {
          pcVar8 = (char *)0x8;
        }
        (aVar4.p)->identifier = pcVar8;
        pgVar5 = (gravity_value_t *)realloc(pgVar5,(long)pcVar8 << 4);
        *(gravity_value_t **)&(aVar4.p)->has_outer = pgVar5;
        pcVar6 = (char *)((gravity_value_r *)&(aVar4.p)->objclass)->n;
      }
      ((gravity_value_r *)&(aVar4.p)->objclass)->n = (size_t)(pcVar6 + 1);
      gVar12 = gravity_string_to_value(vm,(char *)s,len);
      pgVar5[(long)pcVar6].isa = gVar12.isa;
      pgVar5[(long)pcVar6].field_1.n = (gravity_int_t)gVar12.field_1;
      gravity_gc_setenabled(vm,true);
      pgVar10 = (aVar4.p)->isa;
    }
    value.field_1.p = (gravity_object_t *)aVar4.n;
    value.isa = pgVar10;
    gravity_vm_setslot(vm,value,rindex);
    _Var7 = true;
  }
  else {
    builtin_strncpy(_buffer + 0x20,"separator.",0xb);
    builtin_strncpy(_buffer + 0x10,"xpects 1 string ",0x10);
    builtin_strncpy(_buffer,"String.split() e",0x10);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,_buffer);
    _Var7 = false;
    gVar12.field_1.n = 0;
    gVar12.isa = gravity_class_null;
    gravity_vm_setslot(vm,gVar12,rindex);
  }
  return _Var7;
}

Assistant:

static bool string_split (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // sanity check
    if ((nargs != 2) || (!VALUE_ISA_STRING(GET_VALUE(1)))) RETURN_ERROR("String.split() expects 1 string separator.");

    // setup arguments
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    gravity_string_t *substr = VALUE_AS_STRING(GET_VALUE(1));
    const char *sep = substr->s;
    uint32_t seplen = substr->len;
    
    // this is a quite complex situation
    // list should not be trasferred to GC bacause it could be freed by VALUE_FROM_STRING
    // and the same applied to each VALUE_FROM_STRING
    // but in order to use NULL as vm parameter I should keep track of each individual allocation here
    // and then transfer all of them to the VM at the end of the loop (in order to be able to have them
    // freed by the GC)
    // I think it is too much work, the easier solution is just to disable GC during execution loop
    
    gravity_gc_setenabled(vm, false);

    // initialize the list to have a size of 0
    gravity_list_t *list = gravity_list_new(vm, 0);

    char *original = string->s;
    uint32_t slen = string->len;

    // if the separator is empty, then we split the string at every character
    if (seplen == 0) {
        for (uint32_t i=0; i<slen;) {
            uint32_t n = utf8_charbytes(original, 0);
            marray_push(gravity_value_t, list->array, VALUE_FROM_STRING(vm, original, n));
            original += n;
            i += n;
        }
        gravity_gc_setenabled(vm, true);
        RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
    }

    // split loop
    while (1) {
        char *p = string_strnstr(original, sep, (size_t)slen);
        if (p == NULL) {
			marray_push(gravity_value_t, list->array, VALUE_FROM_STRING(vm, original, slen));
            break;
        }
        uint32_t vlen = (uint32_t)(p-original);
		marray_push(gravity_value_t, list->array, VALUE_FROM_STRING(vm, original, vlen));

        // update pointer and slen
        original = p + seplen;
        slen -= vlen + seplen;
    }
    
    gravity_gc_setenabled(vm, true);
    RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
}